

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<SafeSymbols>::moveAppend
          (QGenericArrayOps<SafeSymbols> *this,SafeSymbols *b,SafeSymbols *e)

{
  qsizetype *pqVar1;
  SafeSymbols *pSVar2;
  long lVar3;
  Data *pDVar4;
  Symbol *pSVar5;
  qsizetype qVar6;
  Data *pDVar7;
  char *pcVar8;
  Data *pDVar9;
  
  if ((b != e) && (b < e)) {
    pSVar2 = (this->super_QArrayDataPointer<SafeSymbols>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<SafeSymbols>).size;
      pDVar4 = (b->symbols).d.d;
      (b->symbols).d.d = (Data *)0x0;
      pSVar2[lVar3].symbols.d.d = pDVar4;
      pSVar5 = (b->symbols).d.ptr;
      (b->symbols).d.ptr = (Symbol *)0x0;
      pSVar2[lVar3].symbols.d.ptr = pSVar5;
      qVar6 = (b->symbols).d.size;
      (b->symbols).d.size = 0;
      pSVar2[lVar3].symbols.d.size = qVar6;
      pDVar7 = (b->expandedMacro).d.d;
      (b->expandedMacro).d.d = (Data *)0x0;
      pSVar2[lVar3].expandedMacro.d.d = pDVar7;
      pcVar8 = (b->expandedMacro).d.ptr;
      (b->expandedMacro).d.ptr = (char *)0x0;
      pSVar2[lVar3].expandedMacro.d.ptr = pcVar8;
      qVar6 = (b->expandedMacro).d.size;
      (b->expandedMacro).d.size = 0;
      pSVar2[lVar3].expandedMacro.d.size = qVar6;
      pDVar9 = (b->excludedSymbols).q_hash.d;
      (b->excludedSymbols).q_hash.d = (Data *)0x0;
      pSVar2[lVar3].excludedSymbols.q_hash.d = pDVar9;
      pSVar2[lVar3].index = b->index;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<SafeSymbols>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }